

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O2

void musig_nonce_bitflip(uchar **args,size_t n_flip,size_t n_bytes)

{
  undefined8 uVar1;
  char *pcVar2;
  secp256k1_scalar k2 [2];
  secp256k1_scalar k1 [2];
  secp256k1_scalar local_a8;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  secp256k1_scalar local_68;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  
  secp256k1_nonce_function_musig(&local_68,*args,args[1],args[2],args[3],args[4],args[5]);
  testrand_flip(args[n_flip],n_bytes);
  secp256k1_nonce_function_musig(&local_a8,*args,args[1],args[2],args[3],args[4],args[5]);
  if ((((local_68.d[0] == local_a8.d[0]) && (local_68.d[1] == local_a8.d[1])) &&
      (local_68.d[2] == local_a8.d[2])) && (local_68.d[3] == local_a8.d[3])) {
    pcVar2 = "test condition failed: secp256k1_scalar_eq(&k1[0], &k2[0]) == 0";
    uVar1 = 0x1ec;
  }
  else {
    if (((local_48 != local_88) || (local_40 != local_80)) ||
       ((local_38 != local_78 || (local_30 != local_70)))) {
      return;
    }
    pcVar2 = "test condition failed: secp256k1_scalar_eq(&k1[1], &k2[1]) == 0";
    uVar1 = 0x1ed;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/musig/tests_impl.h"
          ,uVar1,pcVar2);
  abort();
}

Assistant:

static void musig_nonce_bitflip(unsigned char **args, size_t n_flip, size_t n_bytes) {
    secp256k1_scalar k1[2], k2[2];

    secp256k1_nonce_function_musig(k1, args[0], args[1], args[2], args[3], args[4], args[5]);
    testrand_flip(args[n_flip], n_bytes);
    secp256k1_nonce_function_musig(k2, args[0], args[1], args[2], args[3], args[4], args[5]);
    CHECK(secp256k1_scalar_eq(&k1[0], &k2[0]) == 0);
    CHECK(secp256k1_scalar_eq(&k1[1], &k2[1]) == 0);
}